

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O0

boolean encode_mcu_DC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  long lVar1;
  int iVar2;
  long in_RSI;
  long *in_RDI;
  jpeg_component_info *compptr;
  JBLOCKROW block;
  int Al;
  int ci;
  int blkn;
  int nbits;
  int temp2;
  int temp;
  huff_entropy_ptr entropy;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  huff_entropy_ptr in_stack_ffffffffffffffc0;
  huff_entropy_ptr entropy_00;
  short *psVar3;
  undefined4 uVar4;
  int iVar5;
  int local_28;
  int local_24;
  int local_1c;
  
  lVar1 = in_RDI[0x46];
  uVar4 = (undefined4)in_RDI[0x3b];
  *(undefined8 *)(lVar1 + 200) = *(undefined8 *)in_RDI[5];
  *(undefined8 *)(lVar1 + 0xd0) = *(undefined8 *)(in_RDI[5] + 8);
  if ((*(int *)((long)in_RDI + 0x13c) != 0) && (*(int *)(lVar1 + 0x38) == 0)) {
    emit_restart_e(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  for (local_28 = 0; local_28 < (int)in_RDI[0x34]; local_28 = local_28 + 1) {
    psVar3 = *(short **)(in_RSI + (long)local_28 * 8);
    iVar5 = *(int *)((long)in_RDI + (long)local_28 * 4 + 0x1a4);
    entropy_00 = (huff_entropy_ptr)in_RDI[(long)iVar5 + 0x2f];
    iVar2 = (int)*psVar3 >> ((byte)uVar4 & 0x1f);
    local_1c = iVar2 - *(int *)(lVar1 + 0x24 + (long)iVar5 * 4);
    *(int *)(lVar1 + 0x24 + (long)iVar5 * 4) = iVar2;
    if (local_1c < 0) {
      local_1c = -local_1c;
    }
    local_24 = 0;
    for (; local_1c != 0; local_1c = local_1c >> 1) {
      local_24 = local_24 + 1;
    }
    if (0xb < local_24) {
      *(undefined4 *)(*in_RDI + 0x28) = 6;
      (**(code **)*in_RDI)(in_RDI);
    }
    emit_dc_symbol(entropy_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    if (local_24 != 0) {
      emit_bits_e((huff_entropy_ptr)CONCAT44(iVar5,uVar4),(uint)((ulong)psVar3 >> 0x20),(int)psVar3)
      ;
    }
  }
  *(undefined8 *)in_RDI[5] = *(undefined8 *)(lVar1 + 200);
  *(undefined8 *)(in_RDI[5] + 8) = *(undefined8 *)(lVar1 + 0xd0);
  if (*(int *)((long)in_RDI + 0x13c) != 0) {
    if (*(int *)(lVar1 + 0x38) == 0) {
      *(undefined4 *)(lVar1 + 0x38) = *(undefined4 *)((long)in_RDI + 0x13c);
      *(int *)(lVar1 + 0x3c) = *(int *)(lVar1 + 0x3c) + 1;
      *(uint *)(lVar1 + 0x3c) = *(uint *)(lVar1 + 0x3c) & 7;
    }
    *(int *)(lVar1 + 0x38) = *(int *)(lVar1 + 0x38) + -1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_DC_first (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl;
  int v, v2, m;
  ISHIFT_TEMPS

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    tbl = cinfo->cur_comp_info[ci]->dc_tbl_no;

    /* Compute the DC value after the required point transform by Al.
     * This is simply an arithmetic right shift.
     */
    m = IRIGHT_SHIFT((int) ((*block)[0]), cinfo->Al);

    /* Sections F.1.4.1 & F.1.4.4.1: Encoding of DC coefficients */

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.4: Encode_DC_DIFF */
    if ((v = m - entropy->last_dc_val[ci]) == 0) {
      arith_encode(cinfo, st, 0);
      entropy->dc_context[ci] = 0;	/* zero diff category */
    } else {
      entropy->last_dc_val[ci] = m;
      arith_encode(cinfo, st, 1);
      /* Figure F.6: Encoding nonzero value v */
      /* Figure F.7: Encoding the sign of v */
      if (v > 0) {
	arith_encode(cinfo, st + 1, 0);	/* Table F.4: SS = S0 + 1 */
	st += 2;			/* Table F.4: SP = S0 + 2 */
	entropy->dc_context[ci] = 4;	/* small positive diff category */
      } else {
	v = -v;
	arith_encode(cinfo, st + 1, 1);	/* Table F.4: SS = S0 + 1 */
	st += 3;			/* Table F.4: SN = S0 + 3 */
	entropy->dc_context[ci] = 8;	/* small negative diff category */
      }
      /* Figure F.8: Encoding the magnitude category of v */
      m = 0;
      if (v -= 1) {
	arith_encode(cinfo, st, 1);
	m = 1;
	v2 = v;
	st = entropy->dc_stats[tbl] + 20; /* Table F.4: X1 = 20 */
	while (v2 >>= 1) {
	  arith_encode(cinfo, st, 1);
	  m <<= 1;
	  st += 1;
	}
      }
      arith_encode(cinfo, st, 0);
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int) ((1L << cinfo->arith_dc_L[tbl]) >> 1))
	entropy->dc_context[ci] = 0;	/* zero diff category */
      else if (m > (int) ((1L << cinfo->arith_dc_U[tbl]) >> 1))
	entropy->dc_context[ci] += 8;	/* large diff category */
      /* Figure F.9: Encoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	arith_encode(cinfo, st, (m & v) ? 1 : 0);
    }
  }

  return TRUE;
}